

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * constString(xmlTextReaderPtr reader,xmlChar *string)

{
  xmlChar *pxVar1;
  
  if (string == (xmlChar *)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlDictLookup(reader->dict,string,-1);
    if (pxVar1 == (xmlChar *)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return pxVar1;
}

Assistant:

static const xmlChar *
constString(xmlTextReaderPtr reader, const xmlChar *string) {
    const xmlChar *dictString;

    if (string == NULL)
        return(NULL);

    dictString = xmlDictLookup(reader->dict, string, -1);
    if (dictString == NULL)
        xmlTextReaderErrMemory(reader);

    return(dictString);
}